

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionPosition.h
# Opt level: O2

ChVector<double> * __thiscall
chrono::ChFunctionPosition::Get_p_dsds
          (ChVector<double> *__return_storage_ptr__,ChFunctionPosition *this,double s)

{
  undefined1 auVar1 [16];
  ChVector<double> *v;
  undefined1 auVar2 [16];
  undefined1 local_58 [16];
  double local_48;
  undefined1 local_38 [16];
  double local_28;
  
  (*this->_vptr_ChFunctionPosition[4])(s + 1e-07,local_38);
  (*this->_vptr_ChFunctionPosition[4])(s,local_58,this);
  auVar2 = vsubpd_avx(local_38,local_58);
  auVar1._8_8_ = 0x416312d000000000;
  auVar1._0_8_ = 0x416312d000000000;
  auVar2 = vmulpd_avx512vl(auVar2,auVar1);
  *(undefined1 (*) [16])__return_storage_ptr__->m_data = auVar2;
  __return_storage_ptr__->m_data[2] = (local_28 - local_48) * 10000000.0;
  return __return_storage_ptr__;
}

Assistant:

virtual ChVector<> Get_p_dsds(double s) const { return ((Get_p_ds(s + BDF_STEP_LOW) - Get_p_ds(s)) / BDF_STEP_LOW); }